

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

void __thiscall
HighsCliqueTable::cliquePartition
          (HighsCliqueTable *this,
          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *clqVars
          ,vector<int,_std::allocator<int>_> *partitionStart)

{
  HighsCliqueTable *this_00;
  size_type sVar1;
  CliqueVar *in_RDX;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *in_RSI;
  int64_t *in_RDI;
  HighsInt extensionStart;
  CliqueVar v;
  HighsInt i;
  HighsInt extensionEnd;
  HighsInt numClqVars;
  vector<int,_std::allocator<int>_> neighbourhoodInds;
  value_type_conflict2 *in_stack_ffffffffffffff68;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  HighsInt in_stack_ffffffffffffff7c;
  HighsRandom *in_stack_ffffffffffffff80;
  CliqueVar *q;
  vector<int,_std::allocator<int>_> *neighbourhoodInds_00;
  vector<int,_std::allocator<int>_> *this_01;
  int local_4c;
  int local_44;
  vector<int,_std::allocator<int>_> local_30;
  CliqueVar *local_18;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *local_10;
  
  neighbourhoodInds_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x38);
  local_18 = in_RDX;
  local_10 = in_RSI;
  this_00 = (HighsCliqueTable *)
            std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
            data((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)0x5361e4);
  std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::size
            (local_10);
  HighsRandom::shuffle<HighsCliqueTable::CliqueVar>
            (in_stack_ffffffffffffff80,
             (CliqueVar *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             (HighsInt)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  this_01 = &local_30;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x536216);
  std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::size
            (local_10);
  std::vector<int,_std::allocator<int>_>::reserve(this_01,(size_type)this_00);
  sVar1 = std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          size(local_10);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x536250);
  std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::size
            (local_10);
  std::vector<int,_std::allocator<int>_>::reserve(this_01,(size_type)this_00);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  q = local_18;
  local_44 = (int)sVar1;
  for (local_4c = 0; local_4c < (int)sVar1; local_4c = local_4c + 1) {
    if (local_4c == local_44) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)q,
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
    operator[](local_10,(long)local_4c);
    std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::data
              ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
               0x536342);
    in_stack_ffffffffffffff7c =
         partitionNeighbourhood
                   (this_00,neighbourhoodInds_00,in_RDI,SUB84((ulong)this_01 >> 0x20,0),q,
                    in_stack_ffffffffffffff7c);
    local_44 = in_stack_ffffffffffffff7c + local_4c + 1;
  }
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)q,
             (value_type_conflict2 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)q);
  return;
}

Assistant:

void HighsCliqueTable::cliquePartition(std::vector<CliqueVar>& clqVars,
                                       std::vector<HighsInt>& partitionStart) {
  randgen.shuffle(clqVars.data(), clqVars.size());

  std::vector<HighsInt> neighbourhoodInds;
  neighbourhoodInds.reserve(clqVars.size());

  HighsInt numClqVars = clqVars.size();
  partitionStart.clear();
  partitionStart.reserve(clqVars.size());
  HighsInt extensionEnd = numClqVars;
  partitionStart.push_back(0);
  for (HighsInt i = 0; i < numClqVars; ++i) {
    if (i == extensionEnd) {
      partitionStart.push_back(i);
      extensionEnd = numClqVars;
    }
    CliqueVar v = clqVars[i];
    HighsInt extensionStart = i + 1;
    extensionEnd =
        partitionNeighbourhood(neighbourhoodInds, numNeighbourhoodQueries, v,
                               clqVars.data() + extensionStart,
                               extensionEnd - extensionStart) +
        extensionStart;
  }

  partitionStart.push_back(numClqVars);
}